

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlErrMemory(xmlParserCtxtPtr ctxt,char *extra)

{
  char *msg;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if ((ctxt->disableSAX != 0) && (ctxt->instate == XML_PARSER_EOF)) {
      return;
    }
    ctxt->errNo = 2;
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
  }
  if (extra == (char *)0x0) {
    msg = "Memory allocation failed\n";
    extra = (char *)0x0;
  }
  else {
    msg = "Memory allocation failed : %s\n";
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,(void *)0x0,
                  1,2,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,msg);
  return;
}

Assistant:

void
xmlErrMemory(xmlParserCtxtPtr ctxt, const char *extra)
{
    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL) {
        ctxt->errNo = XML_ERR_NO_MEMORY;
        ctxt->instate = XML_PARSER_EOF;
        ctxt->disableSAX = 1;
    }
    if (extra)
        __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_PARSER,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, extra,
                        NULL, NULL, 0, 0,
                        "Memory allocation failed : %s\n", extra);
    else
        __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_PARSER,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, NULL,
                        NULL, NULL, 0, 0, "Memory allocation failed\n");
}